

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_dmc.c
# Opt level: O2

UINT32 NES_DMC_np_Render(void *chip,INT32 *b)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  short sVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  bool bVar17;
  int local_4c [7];
  
  uVar16 = *(long *)((long)chip + 0x40120) + *(long *)((long)chip + 0x40118);
  *(ulong *)((long)chip + 0x40120) = uVar16 & 0xffffffff;
  iVar15 = (int)(uVar16 >> 0x20);
  iVar3 = *(int *)((long)chip + 0x40100) + iVar15;
  *(int *)((long)chip + 0x40100) = iVar3;
  iVar9 = *(int *)((long)chip + 0x40104);
  while (iVar9 < iVar3) {
    FrameSequence((NES_DMC *)chip,*(int *)((long)chip + 0x40108));
    iVar9 = *(int *)((long)chip + 0x40104);
    iVar3 = *(int *)((long)chip + 0x40100) - iVar9;
    *(int *)((long)chip + 0x40100) = iVar3;
    iVar8 = *(int *)((long)chip + 0x40108) + 1;
    if (*(int *)((long)chip + 0x4010c) <= iVar8) {
      iVar8 = 0;
    }
    *(int *)((long)chip + 0x40108) = iVar8;
  }
  if (((*(int *)((long)chip + 0x400c4) < 1) || (*(int *)((long)chip + 0x400f0) < 1)) ||
     (uVar4 = *(uint *)((long)chip + 0x400c0), *(int *)((long)chip + 0x40020) != 0 && uVar4 == 0)) {
    if ((*(int *)((long)chip + 0x40024) != 0) &&
       (uVar4 = *(uint *)((long)chip + 0x400b4), (int)uVar4 < 0x1f && uVar4 != 0)) {
      uVar7 = *(int *)((long)chip + 0x400a8) + iVar15;
      while ((*(uint *)((long)chip + 0x400c0) < uVar7 && (uVar4 != 0))) {
        uVar4 = uVar4 + 1 & 0x1f;
        *(uint *)((long)chip + 0x400b4) = uVar4;
        uVar7 = uVar7 + ~*(uint *)((long)chip + 0x400c0);
      }
      goto LAB_0015609d;
    }
  }
  else {
    for (uVar7 = *(int *)((long)chip + 0x400a8) + iVar15; uVar4 < uVar7; uVar7 = uVar7 + ~uVar4) {
      *(uint *)((long)chip + 0x400b4) = *(int *)((long)chip + 0x400b4) + 1U & 0x1f;
    }
LAB_0015609d:
    *(uint *)((long)chip + 0x400a8) = uVar7;
  }
  uVar14 = (ulong)*(uint *)(calc_tri_tritbl + (long)*(int *)((long)chip + 0x400b4) * 4);
  *(uint *)((long)chip + 0x40068) =
       *(uint *)(calc_tri_tritbl + (long)*(int *)((long)chip + 0x400b4) * 4);
  puVar6 = (uint *)((long)chip + 0x400d0);
  if (*(char *)((long)chip + 0x400dd) == '\0') {
    puVar6 = (uint *)((long)chip + 0x400e8);
  }
  uVar4 = 0;
  if (0 < *(int *)((long)chip + 0x400f4)) {
    uVar4 = *puVar6;
  }
  uVar7 = *(uint *)((long)chip + 0x400d4);
  uVar5 = (int)(uVar7 << 0x11) >> 0x1f & uVar4;
  if (uVar16 >> 0x20 != 0) {
    iVar9 = *(int *)((long)chip + 0x400ac);
    uVar2 = *(uint *)((long)chip + 0x400b8);
    uVar12 = iVar9 + iVar15;
    *(uint *)((long)chip + 0x400ac) = uVar12;
    if (uVar2 != 0) {
      iVar9 = -iVar9;
      uVar11 = 0;
      iVar3 = 0;
      iVar8 = 0;
      while (uVar2 <= uVar12) {
        uVar7 = uVar7 >> 1 |
                ((uint)((*(uint *)((long)chip + 0x400d8) & uVar7) != 0) ^ uVar7 & 1) << 0xe;
        *(uint *)((long)chip + 0x400d4) = uVar7;
        iVar3 = iVar3 + 1;
        iVar8 = iVar8 + uVar5;
        uVar5 = (int)(uVar7 << 0x11) >> 0x1f & uVar4;
        *(uint *)((long)chip + 0x400ac) = uVar12 - uVar2;
        iVar9 = iVar9 + uVar2;
        uVar11 = uVar11 + iVar15;
        uVar12 = uVar12 - uVar2;
      }
      if (iVar3 != 0) {
        uVar5 = (uVar5 * uVar12 * iVar3 + iVar8 * iVar9) / uVar11;
      }
    }
  }
  *(uint *)((long)chip + 0x4006c) = uVar5;
  uVar7 = *(int *)((long)chip + 0x400b0) + iVar15;
  *(uint *)((long)chip + 0x400b0) = uVar7;
  uVar4 = *(uint *)((long)chip + 0x400bc);
  if (uVar4 != 0) {
    while (uVar4 <= uVar7) {
      uVar2 = *(uint *)((long)chip + 0x4007c);
      if (uVar2 == 0x100) {
        iVar9 = *(int *)((long)chip + 0x40078);
LAB_0015623f:
        if (*(char *)((long)chip + 0x400a5) == '\0') goto LAB_0015628d;
        *(uint *)((long)chip + 0x4007c) =
             *(byte *)(*(long *)((long)chip + 0x40060) + (ulong)*(uint *)((long)chip + 0x40074)) |
             0x10000;
        if (iVar9 != 0) {
          *(uint *)((long)chip + 0x40074) = *(uint *)((long)chip + 0x40074) + 1 & 0xffff | 0x8000;
          iVar9 = iVar9 + -1;
          *(int *)((long)chip + 0x40078) = iVar9;
          goto LAB_0015628d;
        }
LAB_00156292:
        if ((*(uint *)((long)chip + 0x400a0) & 1) == 0) {
          if (*(uint *)((long)chip + 0x400a0) == 2) {
            bVar17 = *(char *)((long)chip + 0x400a5) != '\0';
          }
          else {
            bVar17 = false;
          }
          *(bool *)((long)chip + 0x400a4) = bVar17;
          *(undefined1 *)((long)chip + 0x400a5) = 0;
        }
        else {
          *(uint *)((long)chip + 0x40074) = *(int *)((long)chip + 0x40058) << 6 | 0xc000;
          *(int *)((long)chip + 0x40078) = *(int *)((long)chip + 0x40054) * 0x10 + 1;
        }
      }
      else {
        sVar1 = *(short *)((long)chip + 0x40080);
        if ((uVar2 & 1) == 0) {
          sVar13 = -1;
          if (0 < sVar1) {
LAB_00156216:
            *(short *)((long)chip + 0x40080) = sVar13 + sVar1;
          }
        }
        else {
          sVar13 = 1;
          if (sVar1 < 0x3f) goto LAB_00156216;
        }
        *(uint *)((long)chip + 0x4007c) = uVar2 >> 1;
        iVar9 = *(int *)((long)chip + 0x40078);
        if (uVar2 >> 1 == 0x100) goto LAB_0015623f;
LAB_0015628d:
        if (iVar9 == 0) goto LAB_00156292;
      }
      *(uint *)((long)chip + 0x400b0) = uVar7 - uVar4;
      uVar7 = uVar7 - uVar4;
    }
  }
  uVar4 = *(uint *)((long)chip + 0x40028);
  if ((uVar4 & 1) != 0) {
    uVar14 = 0;
  }
  if ((uVar4 & 2) != 0) {
    uVar5 = 0;
  }
  *(int *)((long)chip + 0x40068) = (int)uVar14;
  uVar7 = *(short *)((long)chip + 0x40080) * 2 + *(int *)((long)chip + 0x40084);
  if ((uVar4 & 4) != 0) {
    uVar7 = 0;
  }
  *(uint *)((long)chip + 0x4006c) = uVar5;
  *(uint *)((long)chip + 0x40070) = uVar7;
  local_4c[0] = *(int *)((long)chip + uVar14 * 0x2000 + 8);
  local_4c[1] = *(int *)((long)chip + (ulong)uVar5 * 0x200 + 8);
  local_4c[2] = *(int *)((long)chip + (ulong)uVar7 * 4 + 8);
  if (*(int *)((long)chip + 0x4000c) != 0) {
    iVar9 = *(int *)((long)chip +
                    (ulong)uVar7 * 4 + (ulong)uVar5 * 0x200 + uVar14 * 0x2000 + 0x20008);
    iVar3 = local_4c[1] + local_4c[0] + local_4c[2];
    if (iVar3 == 0) {
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        local_4c[lVar10] = iVar9;
      }
    }
    else {
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        local_4c[lVar10] = (local_4c[lVar10] * iVar9) / iVar3;
      }
    }
  }
  if (*(int *)((long)chip + 0x40018) != 0) {
    if (*(char *)((long)chip + 0x40088) == '\0') {
      iVar9 = *(int *)((long)chip + 0x4008c);
    }
    else {
      iVar9 = (*(int *)((long)chip + 0x40090) - local_4c[2]) + *(int *)((long)chip + 0x4008c);
      *(int *)((long)chip + 0x4008c) = iVar9;
      *(undefined1 *)((long)chip + 0x40088) = 0;
      if (iVar9 < 0x3ffc0001) {
        if (iVar9 < -0x3ffc0000) {
          *(undefined4 *)((long)chip + 0x4008c) = 0xc0040000;
          iVar9 = -0x3ffc0000;
        }
      }
      else {
        *(undefined4 *)((long)chip + 0x4008c) = 0x3ffc0000;
        iVar9 = 0x3ffc0000;
      }
    }
    *(int *)((long)chip + 0x40090) = local_4c[2];
    local_4c[2] = local_4c[2] + iVar9;
    if (iVar9 < 1) {
      if (-1 < iVar9) goto LAB_0015645d;
      iVar3 = 1;
    }
    else {
      iVar3 = -1;
    }
    *(int *)((long)chip + 0x4008c) = iVar9 + iVar3;
  }
LAB_0015645d:
  iVar9 = *(int *)((long)chip + 0x4002c) * local_4c[0];
  *b = iVar9;
  iVar9 = *(int *)((long)chip + 0x40030) * local_4c[1] + iVar9;
  *b = iVar9;
  *b = iVar9 - *(int *)((long)chip + 0x40034) * local_4c[2] >> 5;
  local_4c[0] = local_4c[0] * *(int *)((long)chip + 0x40038);
  b[1] = local_4c[0];
  local_4c[0] = local_4c[1] * *(int *)((long)chip + 0x4003c) + local_4c[0];
  b[1] = local_4c[0];
  b[1] = local_4c[0] - local_4c[2] * *(int *)((long)chip + 0x40040) >> 5;
  return 2;
}

Assistant:

UINT32 NES_DMC_np_Render(void* chip, INT32 b[2])
{
	NES_DMC* dmc = (NES_DMC*)chip;
	UINT32 clocks;
	INT32 m[3];

	RC_STEP(&dmc->tick_count);
	clocks = RC_GET_VAL(&dmc->tick_count);
	RC_MASK(&dmc->tick_count);
	TickFrameSequence(dmc, clocks);
	Tick(dmc, clocks);

	dmc->out[0] = (dmc->mask & 1) ? 0 : dmc->out[0];
	dmc->out[1] = (dmc->mask & 2) ? 0 : dmc->out[1];
	dmc->out[2] = (dmc->mask & 4) ? 0 : dmc->out[2];

	m[0] = dmc->tnd_table[0][dmc->out[0]][0][0];
	m[1] = dmc->tnd_table[0][0][dmc->out[1]][0];
	m[2] = dmc->tnd_table[0][0][0][dmc->out[2]];

	if (dmc->option[OPT_NONLINEAR_MIXER])
	{
		INT32 ref = m[0] + m[1] + m[2];
		INT32 voltage = dmc->tnd_table[1][dmc->out[0]][dmc->out[1]][dmc->out[2]];
		int i;
		if (ref)
		{
			for (i=0; i < 3; ++i)
				m[i] = (m[i] * voltage) / ref;
		}
		else
		{
			for (i=0; i < 3; ++i)
				m[i] = voltage;
		}
	}

	// anti-click nullifies any 4011 write but preserves nonlinearity
	if (dmc->option[OPT_DPCM_ANTI_CLICK])
	{
		if (dmc->dmc_pop) // $4011 will cause pop this frame
		{
			// adjust offset to counteract pop
			dmc->dmc_pop_offset += dmc->dmc_pop_follow - m[2];
			dmc->dmc_pop = false;

			// prevent overflow, keep headspace at edges
			//const INT32 OFFSET_MAX = (1 << 30) - (4 << 16);
#define OFFSET_MAX	((1 << 30) - (4 << 16))
			if (dmc->dmc_pop_offset >  OFFSET_MAX) dmc->dmc_pop_offset =  OFFSET_MAX;
			if (dmc->dmc_pop_offset < -OFFSET_MAX) dmc->dmc_pop_offset = -OFFSET_MAX;
		}
		dmc->dmc_pop_follow = m[2]; // remember previous position

		m[2] += dmc->dmc_pop_offset; // apply offset

		// TODO implement this in a better way
		// roll off offset (not ideal, but prevents overflow)
		if (dmc->dmc_pop_offset > 0) --dmc->dmc_pop_offset;
		else if (dmc->dmc_pop_offset < 0) ++dmc->dmc_pop_offset;
	}

	b[0]  = m[0] * dmc->sm[0][0];
	b[0] += m[1] * dmc->sm[0][1];
	b[0] +=-m[2] * dmc->sm[0][2];
	b[0] >>= 7-2;

	b[1]  = m[0] * dmc->sm[1][0];
	b[1] += m[1] * dmc->sm[1][1];
	b[1] +=-m[2] * dmc->sm[1][2];
	b[1] >>= 7-2;

	return 2;
}